

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<int_*> * __thiscall
TPZVec<int_*>::operator=(TPZVec<int_*> *this,initializer_list<int_*> *list)

{
  iterator ppiVar1;
  size_type sVar2;
  int **ppiVar3;
  long lVar4;
  
  (*this->_vptr_TPZVec[3])();
  ppiVar1 = list->_M_array;
  sVar2 = list->_M_len;
  ppiVar3 = this->fStore;
  for (lVar4 = 0; sVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    *(undefined8 *)((long)ppiVar3 + lVar4) = *(undefined8 *)((long)ppiVar1 + lVar4);
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}